

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread_test.cpp
# Opt level: O0

void * test_thread_nonjoinable_func(void *data)

{
  undefined4 local_1c;
  int i;
  pint *counter;
  void *data_local;
  
  is_threads_working = 1;
  for (local_1c = thread_to_wakes; 0 < local_1c; local_1c = local_1c + -1) {
    p_uthread_sleep();
    *(int *)data = *data + 1;
    p_uthread_yield();
  }
  is_threads_working = 0;
  p_uthread_exit(0);
  return (void *)0x0;
}

Assistant:

static void * test_thread_nonjoinable_func (void *data)
{
	pint *counter = static_cast < pint * > (data);

	is_threads_working = TRUE;

	for (int i = thread_to_wakes; i > 0; --i) {
		p_uthread_sleep (10);
		++(*counter);
		p_uthread_yield ();
	}

	is_threads_working = FALSE;

	p_uthread_exit (0);

	return NULL;
}